

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_cell_quality_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,
          REF_DBL min_quality,FILE *file)

{
  uint uVar1;
  REF_GLOB *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  void *data;
  REF_CELL pRVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  REF_INT source;
  char *pcVar9;
  int cell;
  long lVar10;
  REF_MPI pRVar11;
  ulong uVar12;
  REF_INT ncell;
  REF_INT part;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_f4;
  REF_CELL local_f0;
  int local_e4;
  REF_NODE local_e0;
  REF_MPI local_d8;
  long local_d0;
  REF_DBL local_c8;
  double local_c0;
  REF_GLOB *local_b8;
  REF_LONG local_b0;
  REF_INT local_a8 [30];
  
  local_d8 = ref_node->ref_mpi;
  uVar1 = ref_cell->node_per;
  uVar12 = (ulong)uVar1;
  iVar8 = ref_cell->max;
  local_f0 = ref_cell;
  local_e0 = ref_node;
  local_c8 = min_quality;
  local_b8 = l2c;
  local_b0 = ncell_expected;
  if (local_d8->id == 0) {
    if (iVar8 < 1) {
      local_d0 = 0;
    }
    else {
      cell = 0;
      local_d0 = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (RVar3 == 0) {
          uVar4 = ref_cell_part(ref_cell,local_e0,cell,&local_e4);
          if (uVar4 != 0) {
            pcVar9 = "part";
            uVar6 = 0x2f9;
            goto LAB_001203e5;
          }
          ref_cell = local_f0;
          if (local_d8->id == local_e4) {
            uVar4 = ref_node_tet_quality(local_e0,local_a8,&local_c0);
            pRVar2 = local_b8;
            if (uVar4 != 0) {
              pcVar9 = "qual";
              uVar6 = 0x2fb;
              goto LAB_001203e5;
            }
            ref_cell = local_f0;
            if (local_c0 < local_c8) {
              if (0 < (int)uVar1) {
                uVar7 = 0;
                do {
                  fprintf((FILE *)file," %ld",pRVar2[local_a8[uVar7]] + 1);
                  uVar7 = uVar7 + 1;
                } while (uVar12 != uVar7);
              }
              local_d0 = local_d0 + 1;
              fputc(10,(FILE *)file);
              ref_cell = local_f0;
            }
          }
        }
        cell = cell + 1;
        iVar8 = ref_cell->max;
      } while (cell < iVar8);
      if (local_d8->id != 0) goto LAB_0011fd50;
    }
    pRVar11 = local_d8;
    if (1 < local_d8->n) {
      local_e0 = (REF_NODE)(uVar12 * 8);
      source = 1;
      do {
        pRVar11 = local_d8;
        uVar4 = ref_mpi_gather_recv(local_d8,&local_f4,1,1,source);
        if (uVar4 != 0) {
          pcVar9 = "recv ncell";
          uVar6 = 0x30c;
          goto LAB_001203e5;
        }
        uVar4 = local_f4 * uVar1;
        if ((int)uVar4 < 0) {
          uVar6 = 0x30d;
          goto LAB_00120333;
        }
        pRVar5 = (REF_CELL)malloc((ulong)uVar4 << 3);
        if (pRVar5 == (REF_CELL)0x0) {
          uVar6 = 0x30d;
          goto LAB_00120366;
        }
        local_f0 = pRVar5;
        uVar4 = ref_mpi_gather_recv(pRVar11,pRVar5,uVar4,2,source);
        if (uVar4 != 0) {
          pcVar9 = "recv c2n";
          uVar6 = 0x310;
          goto LAB_001203e5;
        }
        local_c8 = (REF_DBL)CONCAT44(local_c8._4_4_,source);
        if (0 < local_f4) {
          lVar10 = 0;
          pRVar5 = local_f0;
          do {
            if (0 < (int)uVar1) {
              uVar7 = 0;
              do {
                *(long *)(&pRVar5->type + uVar7 * 2) = *(long *)(&pRVar5->type + uVar7 * 2) + 1;
                fprintf((FILE *)file," %ld");
                uVar7 = uVar7 + 1;
              } while (uVar12 != uVar7);
            }
            fputc(10,(FILE *)file);
            lVar10 = lVar10 + 1;
            pRVar5 = (REF_CELL)((long)&local_e0->n + (long)&pRVar5->type);
          } while (lVar10 < local_f4);
        }
        local_d0 = local_d0 + 1;
        free(local_f0);
        source = local_c8._0_4_ + 1;
        pRVar11 = local_d8;
      } while (source < local_d8->n);
    }
LAB_00120299:
    if (pRVar11->id != 0) {
      return 0;
    }
    if (local_d0 == local_b0) {
      return 0;
    }
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x338,
           "ref_gather_cell_quality_tec","cell count mismatch",local_b0,local_d0);
LAB_0012033a:
    uVar4 = 1;
  }
  else {
    local_d0 = 0;
LAB_0011fd50:
    local_f4 = 0;
    if (0 < iVar8) {
      iVar8 = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,iVar8,local_a8);
        if (RVar3 == 0) {
          uVar4 = ref_cell_part(ref_cell,local_e0,iVar8,&local_e4);
          if (uVar4 != 0) {
            pcVar9 = "part";
            uVar6 = 0x31e;
            goto LAB_001203e5;
          }
          ref_cell = local_f0;
          if (local_d8->id == local_e4) {
            uVar4 = ref_node_tet_quality(local_e0,local_a8,&local_c0);
            if (uVar4 != 0) {
              pcVar9 = "qual";
              uVar6 = 800;
              goto LAB_001203e5;
            }
            ref_cell = local_f0;
            if (local_c0 < local_c8) {
              local_f4 = local_f4 + 1;
            }
          }
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < ref_cell->max);
    }
    pRVar11 = local_d8;
    uVar4 = ref_mpi_gather_send(local_d8,&local_f4,1,1);
    if (uVar4 == 0) {
      if ((int)(local_f4 * uVar1) < 0) {
        uVar6 = 0x325;
LAB_00120333:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar6,"ref_gather_cell_quality_tec","malloc c2n of REF_GLOB negative");
        goto LAB_0012033a;
      }
      data = malloc((ulong)(local_f4 * uVar1) << 3);
      if (data == (void *)0x0) {
        uVar6 = 0x325;
LAB_00120366:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar6,"ref_gather_cell_quality_tec","malloc c2n of REF_GLOB NULL");
        return 2;
      }
      local_f4 = 0;
      if (0 < local_f0->max) {
        iVar8 = 0;
        pRVar5 = local_f0;
        do {
          RVar3 = ref_cell_nodes(pRVar5,iVar8,local_a8);
          if (RVar3 == 0) {
            uVar4 = ref_cell_part(pRVar5,local_e0,iVar8,&local_e4);
            if (uVar4 != 0) {
              pcVar9 = "part";
              uVar6 = 0x328;
              goto LAB_001203e5;
            }
            pRVar5 = local_f0;
            if (local_d8->id == local_e4) {
              uVar4 = ref_node_tet_quality(local_e0,local_a8,&local_c0);
              if (uVar4 != 0) {
                pcVar9 = "qual";
                uVar6 = 0x32a;
                goto LAB_001203e5;
              }
              pRVar5 = local_f0;
              if (local_c0 < local_c8) {
                if (0 < (int)uVar1) {
                  uVar7 = 0;
                  do {
                    *(REF_GLOB *)((long)data + uVar7 * 8 + (long)(int)(local_f4 * uVar1) * 8) =
                         local_b8[local_a8[uVar7]];
                    uVar7 = uVar7 + 1;
                  } while (uVar12 != uVar7);
                }
                local_f4 = local_f4 + 1;
              }
            }
          }
          iVar8 = iVar8 + 1;
          pRVar11 = local_d8;
        } while (iVar8 < pRVar5->max);
      }
      uVar4 = ref_mpi_gather_send(pRVar11,data,uVar1 * local_f4,2);
      if (uVar4 == 0) {
        free(data);
        goto LAB_00120299;
      }
      pcVar9 = "send c2n";
      uVar6 = 0x333;
    }
    else {
      pcVar9 = "send ncell";
      uVar6 = 0x324;
    }
LAB_001203e5:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar6,
           "ref_gather_cell_quality_tec",(ulong)uVar4,pcVar9);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_quality_tec(
    REF_NODE ref_node, REF_CELL ref_cell, REF_LONG ncell_expected,
    REF_GLOB *l2c, REF_DBL min_quality, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_INT ncell;
  REF_GLOB *c2n;
  REF_INT part, proc;
  REF_LONG ncell_actual;
  REF_DBL quality;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) {
          for (node = 0; node < node_per; node++) {
            globals[node] = l2c[nodes[node]];
            globals[node]++;
            fprintf(file, " " REF_GLOB_FMT, globals[node]);
          }
          ncell_actual++;
          fprintf(file, "\n");
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");
      for (cell = 0; cell < ncell; cell++) {
        for (node = 0; node < node_per; node++) {
          c2n[node + node_per * cell]++;
          fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
        }
        fprintf(file, "\n");
      }
      ncell_actual++;
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) {
          for (node = 0; node < node_per; node++)
            c2n[node + node_per * ncell] = l2c[nodes[node]];
          ncell++;
        }
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");
    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}